

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAddrMode2OffsetOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  cs_struct *h;
  ARM_AM_AddrOpc Op;
  uint uVar3;
  ARM_AM_ShiftOpc ShOpc;
  MCOperand *op;
  MCOperand *op_00;
  int64_t iVar4;
  char *pcVar5;
  uint ImmOffs;
  ARM_AM_AddrOpc subtracted;
  MCOperand *MO2;
  MCOperand *MO1;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  iVar4 = MCOperand_getImm(op_00);
  Op = getAM2Op((uint)iVar4);
  uVar3 = MCOperand_getReg(op);
  if (uVar3 == 0) {
    iVar4 = MCOperand_getImm(op_00);
    uVar3 = getAM2Offset((uint)iVar4);
    if (uVar3 < 10) {
      pcVar5 = ARM_AM_getAddrOpcStr(Op);
      SStream_concat(O,"#%s%u",pcVar5,(ulong)uVar3);
    }
    else {
      pcVar5 = ARM_AM_getAddrOpcStr(Op);
      SStream_concat(O,"#%s0x%x",pcVar5,(ulong)uVar3);
    }
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar3;
      MI->flat_insn->detail->groups
      [(ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x56] = Op == ARM_AM_sub;
      pcVar2 = MI->flat_insn->detail;
      (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
    }
  }
  else {
    pcVar5 = ARM_AM_getAddrOpcStr(Op);
    SStream_concat0(O,pcVar5);
    h = MI->csh;
    uVar3 = MCOperand_getReg(op);
    printRegName(h,O,uVar3);
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar3 = MCOperand_getReg(op);
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar3;
      MI->flat_insn->detail->groups
      [(ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x56] = Op == ARM_AM_sub;
      pcVar2 = MI->flat_insn->detail;
      (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
    }
    iVar4 = MCOperand_getImm(op_00);
    ShOpc = getAM2ShiftOpc((uint)iVar4);
    iVar4 = MCOperand_getImm(op_00);
    uVar3 = getAM2Offset((uint)iVar4);
    printRegImmShift(MI,O,ShOpc,uVar3);
  }
  return;
}

Assistant:

static void printAddrMode2OffsetOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	ARM_AM_AddrOpc subtracted = getAM2Op((unsigned int)MCOperand_getImm(MO2));

	if (!MCOperand_getReg(MO1)) {
		unsigned ImmOffs = getAM2Offset((unsigned int)MCOperand_getImm(MO2));
		if (ImmOffs > HEX_THRESHOLD)
			SStream_concat(O, "#%s0x%x",
					ARM_AM_getAddrOpcStr(subtracted), ImmOffs);
		else
			SStream_concat(O, "#%s%u",
					ARM_AM_getAddrOpcStr(subtracted), ImmOffs);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = ImmOffs;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = subtracted == ARM_AM_sub;
			MI->flat_insn->detail->arm.op_count++;
		}
		return;
	}

	SStream_concat0(O, ARM_AM_getAddrOpcStr(subtracted));
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = subtracted == ARM_AM_sub;
		MI->flat_insn->detail->arm.op_count++;
	}

	printRegImmShift(MI, O, getAM2ShiftOpc((unsigned int)MCOperand_getImm(MO2)),
			getAM2Offset((unsigned int)MCOperand_getImm(MO2)));
}